

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

int64_t wallet::wallet_tests::AddTx
                  (ChainstateManager *chainman,CWallet *wallet,uint32_t lockTime,int64_t mockTime,
                  int64_t blockTime)

{
  uint uVar1;
  long lVar2;
  _Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> _Var3;
  CWalletTx *pCVar4;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>,_bool>
  pVar5;
  undefined1 in_stack_fffffffffffffee8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined1 local_101;
  CMutableTransaction tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock41;
  undefined1 local_b8 [24];
  code *pcStack_a0;
  undefined4 local_98;
  undefined4 local_94;
  TxState state;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&tx);
  state.
  super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  ._M_u._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  state.
  super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  .
  super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  ._M_index = '\x03';
  tx.nLockTime = lockTime;
  SetMockTime(mockTime);
  if (0 < blockTime) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock41,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
               ,0x193,false);
    GetRandHash();
    pVar5 = std::
            _Hashtable<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::piecewise_construct_t_const&,std::tuple<uint256>,std::tuple<>>
                      ((_Hashtable<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&(chainman->m_blockman).m_block_index,&std::piecewise_construct,local_b8,
                       &local_101);
    _Var3 = pVar5.first.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
            _M_cur;
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                    ,0x195,
                    "int64_t wallet::wallet_tests::AddTx(ChainstateManager &, CWallet &, uint32_t, int64_t, int64_t)"
                   );
    }
    *(int *)((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                   _M_cur + 0xa8) = (int)blockTime;
    *(long *)((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                    _M_cur + 0x28) =
         (long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur +
         8;
    local_98 = *(int *)((long)_Var3.
                              super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                              ._M_cur + 0x40);
    local_b8._0_8_ =
         *(undefined8 *)
          ((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur
          + 8);
    local_b8._8_8_ =
         *(undefined8 *)
          ((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur
          + 0x10);
    local_b8._16_8_ =
         *(undefined8 *)
          ((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur
          + 0x18);
    pcStack_a0 = *(code **)((long)_Var3.
                                  super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                                  ._M_cur + 0x20);
    local_94 = 0;
    std::
    variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
    ::operator=((variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
                 *)&state,(TxStateConfirmed *)local_b8);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock41.super_unique_lock);
  }
  std::make_shared<CTransaction_const,CMutableTransaction&>
            ((CMutableTransaction *)&stack0xfffffffffffffee8);
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  local_b8._0_8_ = &state;
  pcStack_a0 = std::
               _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:412:62)>
               ::_M_invoke;
  local_b8._16_8_ =
       std::
       _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:412:62)>
       ::_M_manager;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._0_8_;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xfffffffffffffee8;
  pCVar4 = CWallet::AddToWallet
                     (wallet,tx_00,(TxState *)local_b8,(UpdateWalletTxFn *)&DAT_00000001,false,
                      (bool)in_stack_fffffffffffffee8);
  uVar1 = pCVar4->nTimeSmart;
  std::_Function_base::~_Function_base((_Function_base *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (ulong)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int64_t AddTx(ChainstateManager& chainman, CWallet& wallet, uint32_t lockTime, int64_t mockTime, int64_t blockTime)
{
    CMutableTransaction tx;
    TxState state = TxStateInactive{};
    tx.nLockTime = lockTime;
    SetMockTime(mockTime);
    CBlockIndex* block = nullptr;
    if (blockTime > 0) {
        LOCK(cs_main);
        auto inserted = chainman.BlockIndex().emplace(std::piecewise_construct, std::make_tuple(GetRandHash()), std::make_tuple());
        assert(inserted.second);
        const uint256& hash = inserted.first->first;
        block = &inserted.first->second;
        block->nTime = blockTime;
        block->phashBlock = &hash;
        state = TxStateConfirmed{hash, block->nHeight, /*index=*/0};
    }
    return wallet.AddToWallet(MakeTransactionRef(tx), state, [&](CWalletTx& wtx, bool /* new_tx */) {
        // Assign wtx.m_state to simplify test and avoid the need to simulate
        // reorg events. Without this, AddToWallet asserts false when the same
        // transaction is confirmed in different blocks.
        wtx.m_state = state;
        return true;
    })->nTimeSmart;
}